

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NodePrintFanio(FILE *pFile,Abc_Obj_t *pNode)

{
  char *pcVar1;
  long lVar2;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 3) {
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
  }
  pcVar1 = Abc_ObjName(pNode);
  fprintf((FILE *)pFile,"Node %s",pcVar1);
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,"Fanins (%d): ",(ulong)(uint)(pNode->vFanins).nSize);
  if (0 < (pNode->vFanins).nSize) {
    lVar2 = 0;
    do {
      pcVar1 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar2]]);
      fprintf((FILE *)pFile," %s",pcVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (pNode->vFanins).nSize);
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,"Fanouts (%d): ",(ulong)(uint)(pNode->vFanins).nSize);
  if (0 < (pNode->vFanouts).nSize) {
    lVar2 = 0;
    do {
      pcVar1 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar2]])
      ;
      fprintf((FILE *)pFile," %s",pcVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (pNode->vFanouts).nSize);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_NodePrintFanio( FILE * pFile, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode2;
    int i;
    if ( Abc_ObjIsPo(pNode) )
        pNode = Abc_ObjFanin0(pNode);

    fprintf( pFile, "Node %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );

    fprintf( pFile, "Fanins (%d): ", Abc_ObjFaninNum(pNode) );
    Abc_ObjForEachFanin( pNode, pNode2, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode2) );
    fprintf( pFile, "\n" );

    fprintf( pFile, "Fanouts (%d): ", Abc_ObjFaninNum(pNode) );
    Abc_ObjForEachFanout( pNode, pNode2, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode2) );
    fprintf( pFile, "\n" );
}